

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

void __thiscall cppcms::rpc::json_rpc_server::~json_rpc_server(json_rpc_server *this)

{
  hold_ptr<cppcms::rpc::json_rpc_server::_data> *in_RDI;
  application *in_stack_00000020;
  
  in_RDI->ptr_ = (_data *)&PTR__json_rpc_server_0052f8a0;
  booster::hold_ptr<cppcms::rpc::json_rpc_server::_data>::~hold_ptr(in_RDI);
  std::__cxx11::string::~string((string *)(in_RDI + 0xd));
  std::shared_ptr<cppcms::rpc::json_call>::~shared_ptr
            ((shared_ptr<cppcms::rpc::json_call> *)0x44bf79);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
          *)0x44bf87);
  application::~application(in_stack_00000020);
  return;
}

Assistant:

json_rpc_server::~json_rpc_server()
	{
	}